

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void luaH_resize(lua_State *L,Table *t,int nasize,int nhsize)

{
  byte bVar1;
  int iVar2;
  Node *block;
  TValue *pTVar3;
  Node *pNVar4;
  TValue *io1;
  TValue *io2;
  Node *old;
  Node *nold;
  int oldhsize;
  int oldasize;
  int i;
  int nhsize_local;
  int nasize_local;
  Table *t_local;
  lua_State *L_local;
  
  iVar2 = t->sizearray;
  bVar1 = t->lsizenode;
  block = t->node;
  if (iVar2 < nasize) {
    setarrayvector(L,t,nasize);
  }
  setnodevector(L,t,nhsize);
  if (nasize < iVar2) {
    t->sizearray = nasize;
    for (oldhsize = nasize; oldhsize < iVar2; oldhsize = oldhsize + 1) {
      if (t->array[oldhsize].tt_ != 0) {
        luaH_setint(L,t,oldhsize + 1,t->array + oldhsize);
      }
    }
    if (0xfffffffffffffff < (ulong)(long)(nasize + 1)) {
      luaM_toobig(L);
    }
    pTVar3 = (TValue *)luaM_realloc_(L,t->array,(long)iVar2 << 4,(long)nasize << 4);
    t->array = pTVar3;
  }
  oldhsize = 1 << (bVar1 & 0x1f);
  while (oldhsize = oldhsize + -1, -1 < oldhsize) {
    pNVar4 = block + oldhsize;
    if ((pNVar4->i_val).tt_ != 0) {
      pTVar3 = luaH_set(L,t,&(pNVar4->i_key).tvk);
      pTVar3->value_ = (pNVar4->i_val).value_;
      pTVar3->tt_ = (pNVar4->i_val).tt_;
    }
  }
  if (block != &dummynode_) {
    luaM_realloc_(L,block,(long)(1 << (bVar1 & 0x1f)) * 0x28,0);
  }
  return;
}

Assistant:

void luaH_resize (lua_State *L, Table *t, int nasize, int nhsize) {
  int i;
  int oldasize = t->sizearray;
  int oldhsize = t->lsizenode;
  Node *nold = t->node;  /* save old hash ... */
  if (nasize > oldasize)  /* array part must grow? */
    setarrayvector(L, t, nasize);
  /* create new hash part with appropriate size */
  setnodevector(L, t, nhsize);
  if (nasize < oldasize) {  /* array part must shrink? */
    t->sizearray = nasize;
    /* re-insert elements from vanishing slice */
    for (i=nasize; i<oldasize; i++) {
      if (!ttisnil(&t->array[i]))
        luaH_setint(L, t, i + 1, &t->array[i]);
    }
    /* shrink array */
    luaM_reallocvector(L, t->array, oldasize, nasize, TValue);
  }
  /* re-insert elements from hash part */
  for (i = twoto(oldhsize) - 1; i >= 0; i--) {
    Node *old = nold+i;
    if (!ttisnil(gval(old))) {
      /* doesn't need barrier/invalidate cache, as entry was
         already present in the table */
      setobjt2t(L, luaH_set(L, t, gkey(old)), gval(old));
    }
  }
  if (!isdummy(nold))
    luaM_freearray(L, nold, cast(size_t, twoto(oldhsize))); /* free old array */
}